

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_elements_transaction.cpp
# Opt level: O1

string * __thiscall
cfd::api::ElementsTransactionApi::CreateSignatureHash
          (string *__return_storage_ptr__,ElementsTransactionApi *this,string *tx_hex,
          ConfidentialTxInReference *txin,ByteData *key_data,ConfidentialValue *value,
          HashType hash_type,SigHashType *sighash_type)

{
  ElementsTransactionApi *object;
  Txid local_50;
  
  object = (ElementsTransactionApi *)&(txin->super_AbstractTxInReference).txid_;
  core::Txid::Txid(&local_50,(Txid *)object);
  CreateSignatureHash(__return_storage_ptr__,object,tx_hex,&local_50,
                      (txin->super_AbstractTxInReference).vout_,key_data,value,hash_type,
                      sighash_type);
  local_50._vptr_Txid = (_func_int **)&PTR__Txid_00735400;
  if (local_50.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ElementsTransactionApi::CreateSignatureHash(
    const std::string& tx_hex, const ConfidentialTxInReference& txin,
    const ByteData& key_data, const ConfidentialValue& value,
    HashType hash_type, const SigHashType& sighash_type) const {
  return CreateSignatureHash(
      tx_hex, txin.GetTxid(), txin.GetVout(), key_data, value, hash_type,
      sighash_type);
}